

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateTestCaseUtil.hpp
# Opt level: O2

TestInstance * __thiscall
vkt::DynamicState::
InstanceFactory<vkt::DynamicState::(anonymous_namespace)::StencilParamsAdvancedTestInstance>::
createInstance(InstanceFactory<vkt::DynamicState::(anonymous_namespace)::StencilParamsAdvancedTestInstance>
               *this,Context *context)

{
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  *this_00;
  char *vertexShaderName;
  StencilOpState _front;
  StencilOpState _front_00;
  StencilOpState _back;
  StencilOpState _back_00;
  undefined4 uVar1;
  DepthStencilBaseCase *this_01;
  mapped_type *ppcVar2;
  long lVar3;
  DepthStencilState *pDVar4;
  DepthStencilState *pDVar5;
  byte bVar6;
  StencilOpState frontState_1;
  StencilOpState backState_1;
  StencilOpState frontState_2;
  DepthStencilState local_d0;
  StencilOpState backState_2;
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  local_48;
  
  bVar6 = 0;
  this_01 = (DepthStencilBaseCase *)operator_new(0x2d0);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::_Rb_tree(&local_48,&(this->m_shaderPaths)._M_t);
  local_d0.super_VkPipelineDepthStencilStateCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)&local_48,(key_type *)&local_d0);
  vertexShaderName = *ppcVar2;
  frontState_1.super_VkStencilOpState.failOp = VK_STENCIL_OP_ZERO;
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)&local_48,(key_type *)&frontState_1);
  DynamicState::anon_unknown_0::DepthStencilBaseCase::DepthStencilBaseCase
            (this_01,context,vertexShaderName,*ppcVar2);
  (this_01->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__DepthStencilBaseCase_00c03470;
  frontState_1.super_VkStencilOpState.failOp = 0xbf000000;
  frontState_1.super_VkStencilOpState.passOp = 0x3f000000;
  frontState_1.super_VkStencilOpState.depthFailOp = 0x3f800000;
  frontState_1.super_VkStencilOpState.compareOp = 0x3f800000;
  frontState_2.super_VkStencilOpState.failOp = 0xff00ff00;
  tcu::RGBA::toVec((RGBA *)&frontState_2);
  PositionColorVertex::PositionColorVertex
            ((PositionColorVertex *)&local_d0,(Vec4 *)&frontState_1,(Vec4 *)&backState_1);
  this_00 = &this_01->m_data;
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)&local_d0);
  frontState_1.super_VkStencilOpState.failOp = 0x3f000000;
  frontState_1.super_VkStencilOpState.passOp = 0x3f000000;
  frontState_1.super_VkStencilOpState.depthFailOp = 0x3f800000;
  frontState_1.super_VkStencilOpState.compareOp = 0x3f800000;
  frontState_2.super_VkStencilOpState.failOp = 0xff00ff00;
  tcu::RGBA::toVec((RGBA *)&frontState_2);
  PositionColorVertex::PositionColorVertex
            ((PositionColorVertex *)&local_d0,(Vec4 *)&frontState_1,(Vec4 *)&backState_1);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)&local_d0);
  frontState_1.super_VkStencilOpState.failOp = 0xbf000000;
  frontState_1.super_VkStencilOpState.passOp = 0xbf000000;
  frontState_1.super_VkStencilOpState.depthFailOp = 0x3f800000;
  frontState_1.super_VkStencilOpState.compareOp = 0x3f800000;
  frontState_2.super_VkStencilOpState.failOp = 0xff00ff00;
  tcu::RGBA::toVec((RGBA *)&frontState_2);
  PositionColorVertex::PositionColorVertex
            ((PositionColorVertex *)&local_d0,(Vec4 *)&frontState_1,(Vec4 *)&backState_1);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)&local_d0);
  frontState_1.super_VkStencilOpState.failOp = 0x3f000000;
  frontState_1.super_VkStencilOpState.passOp = 0xbf000000;
  frontState_1.super_VkStencilOpState.depthFailOp = 0x3f800000;
  frontState_1.super_VkStencilOpState.compareOp = 0x3f800000;
  frontState_2.super_VkStencilOpState.failOp = 0xff00ff00;
  tcu::RGBA::toVec((RGBA *)&frontState_2);
  PositionColorVertex::PositionColorVertex
            ((PositionColorVertex *)&local_d0,(Vec4 *)&frontState_1,(Vec4 *)&backState_1);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)&local_d0);
  frontState_1.super_VkStencilOpState.failOp = 0xbf800000;
  frontState_1.super_VkStencilOpState.passOp = 0x3f800000;
  frontState_1.super_VkStencilOpState.depthFailOp = 0x3f800000;
  frontState_1.super_VkStencilOpState.compareOp = 0x3f800000;
  frontState_2.super_VkStencilOpState.failOp = 0xffff0000;
  tcu::RGBA::toVec((RGBA *)&frontState_2);
  PositionColorVertex::PositionColorVertex
            ((PositionColorVertex *)&local_d0,(Vec4 *)&frontState_1,(Vec4 *)&backState_1);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)&local_d0);
  frontState_1.super_VkStencilOpState._0_8_ = &DAT_3f8000003f800000;
  frontState_1.super_VkStencilOpState.depthFailOp = 0x3f800000;
  frontState_1.super_VkStencilOpState.compareOp = 0x3f800000;
  frontState_2.super_VkStencilOpState.failOp = 0xffff0000;
  tcu::RGBA::toVec((RGBA *)&frontState_2);
  PositionColorVertex::PositionColorVertex
            ((PositionColorVertex *)&local_d0,(Vec4 *)&frontState_1,(Vec4 *)&backState_1);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)&local_d0);
  frontState_1.super_VkStencilOpState.failOp = 0xbf800000;
  frontState_1.super_VkStencilOpState.passOp = 0xbf800000;
  frontState_1.super_VkStencilOpState.depthFailOp = 0x3f800000;
  frontState_1.super_VkStencilOpState.compareOp = 0x3f800000;
  frontState_2.super_VkStencilOpState.failOp = 0xffff0000;
  tcu::RGBA::toVec((RGBA *)&frontState_2);
  PositionColorVertex::PositionColorVertex
            ((PositionColorVertex *)&local_d0,(Vec4 *)&frontState_1,(Vec4 *)&backState_1);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)&local_d0);
  frontState_1.super_VkStencilOpState.failOp = 0x3f800000;
  frontState_1.super_VkStencilOpState.passOp = 0xbf800000;
  frontState_1.super_VkStencilOpState.depthFailOp = 0x3f800000;
  frontState_1.super_VkStencilOpState.compareOp = 0x3f800000;
  frontState_2.super_VkStencilOpState.failOp = 0xffff0000;
  tcu::RGBA::toVec((RGBA *)&frontState_2);
  PositionColorVertex::PositionColorVertex
            ((PositionColorVertex *)&local_d0,(Vec4 *)&frontState_1,(Vec4 *)&backState_1);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)&local_d0);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            (&frontState_1,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            (&backState_1,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            (&frontState_2,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_COMPARE_OP_NOT_EQUAL,0xffffffff,0xffffffff,0);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            (&backState_2,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_COMPARE_OP_NOT_EQUAL,0xffffffff,0xffffffff,0);
  _front.super_VkStencilOpState.depthFailOp = frontState_1.super_VkStencilOpState.depthFailOp;
  _front.super_VkStencilOpState.failOp = frontState_1.super_VkStencilOpState.failOp;
  _front.super_VkStencilOpState.passOp = frontState_1.super_VkStencilOpState.passOp;
  _front.super_VkStencilOpState.compareOp = frontState_1.super_VkStencilOpState.compareOp;
  _front.super_VkStencilOpState.compareMask = frontState_1.super_VkStencilOpState.compareMask;
  _front.super_VkStencilOpState.writeMask = frontState_1.super_VkStencilOpState.writeMask;
  _front.super_VkStencilOpState.reference = frontState_1.super_VkStencilOpState.reference;
  _back.super_VkStencilOpState.depthFailOp = backState_1.super_VkStencilOpState.depthFailOp;
  _back.super_VkStencilOpState.failOp = backState_1.super_VkStencilOpState.failOp;
  _back.super_VkStencilOpState.passOp = backState_1.super_VkStencilOpState.passOp;
  _back.super_VkStencilOpState.compareOp = backState_1.super_VkStencilOpState.compareOp;
  _back.super_VkStencilOpState.compareMask = backState_1.super_VkStencilOpState.compareMask;
  _back.super_VkStencilOpState.writeMask = backState_1.super_VkStencilOpState.writeMask;
  _back.super_VkStencilOpState.reference = backState_1.super_VkStencilOpState.reference;
  Draw::PipelineCreateInfo::DepthStencilState::DepthStencilState
            (&local_d0,0,0,VK_COMPARE_OP_NEVER,0,1,_front,_back,0.0,1.0);
  pDVar4 = &local_d0;
  pDVar5 = &this_01->m_depthStencilState_1;
  for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *(undefined4 *)&(pDVar4->super_VkPipelineDepthStencilStateCreateInfo).field_0x4;
    (pDVar5->super_VkPipelineDepthStencilStateCreateInfo).sType =
         (pDVar4->super_VkPipelineDepthStencilStateCreateInfo).sType;
    *(undefined4 *)&(pDVar5->super_VkPipelineDepthStencilStateCreateInfo).field_0x4 = uVar1;
    pDVar4 = (DepthStencilState *)((long)pDVar4 + ((ulong)bVar6 * -2 + 1) * 8);
    pDVar5 = (DepthStencilState *)((long)pDVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  _front_00.super_VkStencilOpState.passOp = frontState_2.super_VkStencilOpState.passOp;
  _front_00.super_VkStencilOpState.failOp = frontState_2.super_VkStencilOpState.failOp;
  _front_00.super_VkStencilOpState.depthFailOp = frontState_2.super_VkStencilOpState.depthFailOp;
  _front_00.super_VkStencilOpState.compareOp = frontState_2.super_VkStencilOpState.compareOp;
  _front_00.super_VkStencilOpState.compareMask = frontState_2.super_VkStencilOpState.compareMask;
  _front_00.super_VkStencilOpState.writeMask = frontState_2.super_VkStencilOpState.writeMask;
  _front_00.super_VkStencilOpState.reference = frontState_2.super_VkStencilOpState.reference;
  _back_00.super_VkStencilOpState.depthFailOp = backState_2.super_VkStencilOpState.depthFailOp;
  _back_00.super_VkStencilOpState.failOp = backState_2.super_VkStencilOpState.failOp;
  _back_00.super_VkStencilOpState.passOp = backState_2.super_VkStencilOpState.passOp;
  _back_00.super_VkStencilOpState.compareOp = backState_2.super_VkStencilOpState.compareOp;
  _back_00.super_VkStencilOpState.compareMask = backState_2.super_VkStencilOpState.compareMask;
  _back_00.super_VkStencilOpState.writeMask = backState_2.super_VkStencilOpState.writeMask;
  _back_00.super_VkStencilOpState.reference = backState_2.super_VkStencilOpState.reference;
  Draw::PipelineCreateInfo::DepthStencilState::DepthStencilState
            (&local_d0,0,0,VK_COMPARE_OP_NEVER,0,1,_front_00,_back_00,0.0,1.0);
  pDVar4 = &local_d0;
  pDVar5 = &this_01->m_depthStencilState_2;
  for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *(undefined4 *)&(pDVar4->super_VkPipelineDepthStencilStateCreateInfo).field_0x4;
    (pDVar5->super_VkPipelineDepthStencilStateCreateInfo).sType =
         (pDVar4->super_VkPipelineDepthStencilStateCreateInfo).sType;
    *(undefined4 *)&(pDVar5->super_VkPipelineDepthStencilStateCreateInfo).field_0x4 = uVar1;
    pDVar4 = (DepthStencilState *)((long)pDVar4 + ((ulong)bVar6 * -2 + 1) * 8);
    pDVar5 = (DepthStencilState *)((long)pDVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  DynamicState::anon_unknown_0::DepthStencilBaseCase::initialize(this_01);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree(&local_48);
  return &this_01->super_TestInstance;
}

Assistant:

TestInstance* createInstance (Context& context) const
	{
		return new Instance(context, m_shaderPaths);
	}